

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void vpermps_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  int iVar2;
  UInt8 UVar3;
  Int32 IVar4;
  Int32 IVar5;
  
  if (((pMyDisasm->Reserved_).VEX.state != '\x01') || ((pMyDisasm->Reserved_).VEX.pp != '\x01'))
  goto LAB_0012a953;
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    UVar3 = (pMyDisasm->Reserved_).EVEX.W;
    if (UVar3 != '\0') {
LAB_0012a919:
      if (UVar3 != '\x01') {
LAB_0012a953:
        builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
        (pMyDisasm->Operand1).AccessMode = 0;
        (pMyDisasm->Operand2).AccessMode = 0;
        (pMyDisasm->Operand3).AccessMode = 0;
        (pMyDisasm->Operand4).AccessMode = 0;
        (pMyDisasm->Operand5).AccessMode = 0;
        (pMyDisasm->Operand6).AccessMode = 0;
        (pMyDisasm->Operand7).AccessMode = 0;
        (pMyDisasm->Operand8).AccessMode = 0;
        (pMyDisasm->Operand9).AccessMode = 0;
        (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
        return;
      }
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpermpd",8);
      if ((pMyDisasm->Reserved_).VEX.L == '\0') {
        (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
      }
      goto joined_r0x0012a9c0;
    }
  }
  else if ((pMyDisasm->Reserved_).REX.W_ != '\0') {
    UVar3 = (pMyDisasm->Reserved_).EVEX.W;
    goto LAB_0012a919;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpermps",8);
  if ((pMyDisasm->Reserved_).VEX.L == '\0') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
joined_r0x0012a9c0:
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
    ArgsVEX(pMyDisasm);
    return;
  }
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    UVar3 = (pMyDisasm->Reserved_).EVEX.vvvv;
  }
  else {
    UVar3 = (pMyDisasm->Reserved_).VEX.vvvv;
  }
  if (UVar3 != '\x0f') {
    (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
  }
  UVar3 = (pMyDisasm->Reserved_).VEX.L;
  if (UVar3 == '\x01') {
    iVar2 = (uint)(UVar1 == '\x01') * 0x20000 + 0x120000;
    IVar4 = 0xd2;
    IVar5 = 8;
  }
  else if (UVar3 == '\0') {
    iVar2 = 0x110000;
    if (UVar1 == '\x01') {
      iVar2 = 0x140000;
    }
    IVar4 = 0xd1;
    IVar5 = 4;
  }
  else {
    if ((pMyDisasm->Reserved_).EVEX.LL != '\x02') {
      return;
    }
    IVar4 = 0xd6;
    IVar5 = 0x10;
    iVar2 = 0x140000;
  }
  (pMyDisasm->Instruction).Category = iVar2;
  (pMyDisasm->Reserved_).Register_ = IVar5;
  (pMyDisasm->Reserved_).MemDecoration = IVar4;
  GyEy(pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 0;
  return;
}

Assistant:

void __bea_callspec__ vpermps_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
      if (GV.VEX.pp == 1) {
        if (
            ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0)) ||
            ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0))
          ) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermps");
          #endif
          if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
          if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
          ArgsVEX(pMyDisasm);
        }
        else if (GV.EVEX.W == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpermpd");
          #endif
          if (GV.VEX.L == 0) GV.ERROR_OPCODE = UD_;
          if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL;
          ArgsVEX(pMyDisasm);
        }
        else {
          failDecode(pMyDisasm);
        }

      }
      else {
        failDecode(pMyDisasm);
      }
  }
  else {
    failDecode(pMyDisasm);
  }
}